

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shared.cpp
# Opt level: O0

int __thiscall Log::overflow(Log *this,int c)

{
  int c_local;
  Log *this_local;
  
  if (c == -1) {
    (**(code **)(*(long *)this + 0x30))();
  }
  else {
    std::__cxx11::string::operator+=((string *)&this->buffer,(char)c);
  }
  return c;
}

Assistant:

int Log::overflow(int c) {
    if (c != EOF) {
        buffer += static_cast<char>(c);
    } else {
        sync();
    }
    return c;
}